

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_fdset(CURLM *m,fd_set *read_fd_set,fd_set *write_fd_set,fd_set *exc_fd_set,
                          int *max_fd)

{
  byte bVar1;
  int iVar2;
  CURLMcode CVar3;
  Curl_llist_node *n;
  Curl_easy *data;
  ulong uVar4;
  int iVar5;
  easy_pollset ps;
  int local_5c;
  int *local_58;
  easy_pollset local_50;
  
  local_5c = -1;
  CVar3 = CURLM_BAD_HANDLE;
  if (((m != (CURLM *)0x0) && (*m == 0xbab1e)) &&
     (CVar3 = CURLM_RECURSIVE_API_CALL, (*(byte *)((long)m + 0x2d1) & 4) == 0)) {
    local_58 = max_fd;
    n = Curl_llist_head((Curl_llist *)((long)m + 0x30));
    if (n != (Curl_llist_node *)0x0) {
      do {
        data = (Curl_easy *)Curl_node_elem(n);
        Curl_multi_getsock(data,&local_50,"curl_multi_fdset");
        if ((ulong)local_50.num != 0) {
          uVar4 = 0;
          do {
            iVar2 = local_50.sockets[uVar4];
            if (iVar2 < 0x400) {
              bVar1 = local_50.actions[uVar4];
              if ((bVar1 & 1) != 0) {
                iVar5 = iVar2 + 0x3f;
                if (-1 < iVar2) {
                  iVar5 = iVar2;
                }
                read_fd_set->fds_bits[iVar5 >> 6] =
                     read_fd_set->fds_bits[iVar5 >> 6] | 1L << ((byte)iVar2 & 0x3f);
              }
              if ((bVar1 & 2) != 0) {
                iVar5 = iVar2 + 0x3f;
                if (-1 < iVar2) {
                  iVar5 = iVar2;
                }
                write_fd_set->fds_bits[iVar5 >> 6] =
                     write_fd_set->fds_bits[iVar5 >> 6] | 1L << ((byte)iVar2 & 0x3f);
              }
              if (local_5c < iVar2) {
                local_5c = iVar2;
              }
            }
            uVar4 = uVar4 + 1;
          } while (local_50.num != uVar4);
        }
        n = Curl_node_next(n);
      } while (n != (Curl_llist_node *)0x0);
    }
    Curl_cshutdn_setfds((cshutdn *)((long)m + 0x1e8),*(Curl_easy **)((long)m + 0x98),read_fd_set,
                        write_fd_set,&local_5c);
    *local_58 = local_5c;
    CVar3 = CURLM_OK;
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *m,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_llist_node *e;
  struct Curl_multi *multi = m;
  unsigned int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    struct easy_pollset ps;

    Curl_multi_getsock(data, &ps, "curl_multi_fdset");

    for(i = 0; i < ps.num; i++) {
      if(!FDSET_SOCK(ps.sockets[i]))
        /* pretend it does not exist */
        continue;
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
      if(ps.actions[i] & CURL_POLL_IN)
        FD_SET(ps.sockets[i], read_fd_set);
      if(ps.actions[i] & CURL_POLL_OUT)
        FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
      if((int)ps.sockets[i] > this_max_fd)
        this_max_fd = (int)ps.sockets[i];
    }
  }

  Curl_cshutdn_setfds(&multi->cshutdn, multi->admin,
                      read_fd_set, write_fd_set, &this_max_fd);

  *max_fd = this_max_fd;

  return CURLM_OK;
}